

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int add_sub_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B,int flip_B)

{
  short sVar1;
  int iVar2;
  int iVar3;
  short sVar4;
  
  sVar1 = A->s;
  if (flip_B * sVar1 * (int)B->s < 0) {
    iVar2 = mbedtls_mpi_cmp_abs(A,B);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_sub_abs(X,B,A);
      if (iVar2 != 0) {
        return iVar2;
      }
      sVar4 = -sVar1;
    }
    else {
      iVar3 = mbedtls_mpi_sub_abs(X,A,B);
      if (iVar3 != 0) {
        return iVar3;
      }
      sVar4 = 1;
      if (iVar2 != 0) {
        sVar4 = sVar1;
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_add_abs(X,A,B);
    sVar4 = sVar1;
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  X->s = sVar4;
  return 0;
}

Assistant:

static int add_sub_mpi(mbedtls_mpi *X,
                       const mbedtls_mpi *A, const mbedtls_mpi *B,
                       int flip_B)
{
    int ret, s;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    s = A->s;
    if (A->s * B->s * flip_B < 0) {
        int cmp = mbedtls_mpi_cmp_abs(A, B);
        if (cmp >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, A, B));
            /* If |A| = |B|, the result is 0 and we must set the sign bit
             * to +1 regardless of which of A or B was negative. Otherwise,
             * since |A| > |B|, the sign is the sign of A. */
            X->s = cmp == 0 ? 1 : s;
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_abs(X, B, A));
            /* Since |A| < |B|, the sign is the opposite of A. */
            X->s = -s;
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_abs(X, A, B));
        X->s = s;
    }

cleanup:

    return ret;
}